

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void __thiscall kpeg::JPEGEncoder::computeDCT(JPEGEncoder *this)

{
  double dVar1;
  double dVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  array<kpeg::FPixel,_8UL> *paVar4;
  Level LVar5;
  uint uVar6;
  Logger *pLVar7;
  ostream *poVar8;
  ulong uVar9;
  pointer pcVar10;
  size_type sVar11;
  Level lvl;
  Level lvl_00;
  int y;
  undefined8 uVar12;
  int c;
  undefined8 uVar13;
  long lVar14;
  float *pfVar15;
  double dVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar18;
  float __x;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 local_3c0 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_398;
  float local_390;
  float Cv;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_388;
  undefined8 local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_370;
  _Alloc_hider local_360;
  ulong local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  array<kpeg::FPixel,_8UL> *local_340;
  ulong local_338;
  array<std::array<kpeg::FPixel,_8UL>,_8UL> coefficients;
  
  pLVar7 = Logger::get();
  LVar5 = Logger::getLevel(pLVar7);
  if (0 < (int)LVar5) {
    pLVar7 = Logger::get();
    poVar8 = Logger::getStream(pLVar7);
    Logger::levelStr_abi_cxx11_((string *)&coefficients,(Logger *)0x1,lvl);
    poVar8 = std::operator<<(poVar8,(string *)&coefficients);
    poVar8 = std::operator<<(poVar8,"[ kpeg:");
    poVar8 = std::operator<<(poVar8,"Encoder.cpp");
    poVar8 = std::operator<<(poVar8,":");
    *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x1b4);
    poVar8 = std::operator<<(poVar8," ] ");
    poVar8 = std::operator<<(poVar8,"Applying Forward DCT on components...");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&coefficients);
  }
  local_3c0._24_8_ = 8;
  uVar12 = 0;
  while( true ) {
    uVar6 = Image::getHeight(&this->m_image);
    if ((ulong)uVar6 <= (uVar12 | 7)) break;
    local_350._M_allocated_capacity = uVar12 + 8;
    local_3c0._16_8_ = 0.0;
    local_358 = 8;
    uVar13 = 0;
    aStack_370._8_8_ = uVar12;
    while( true ) {
      uVar6 = Image::getWidth(&this->m_image);
      if ((ulong)uVar6 <= (uVar13 | 7)) break;
      local_350._8_8_ = uVar13 + 8;
      memset(&coefficients,0,0x300);
      pcVar10 = (pointer)0x0;
      local_338 = uVar13;
      while (pcVar10 != (pointer)0x8) {
        Cv = *(float *)(&DAT_00129cf0 + (ulong)(pcVar10 == (pointer)0x0) * 4);
        local_340 = coefficients._M_elems + (long)pcVar10;
        local_360._M_p = pcVar10;
        for (pfVar15 = (float *)0x0; pfVar15 != (float *)0x8; pfVar15 = (float *)((long)pfVar15 + 1)
            ) {
          local_390 = 0.0;
          local_398._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_3c0._32_8_ = pfVar15;
          for (; uVar12 != local_3c0._24_8_; uVar12 = uVar12 + 1) {
            local_378 = (double)((int)local_360._M_p * ((int)uVar12 * 2 + 1)) * 3.141592653589793 *
                        0.0625;
            dVar16 = (double)local_3c0._16_8_;
            for (uVar9 = local_338; uVar9 != local_358; uVar9 = uVar9 + 1) {
              local_388._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((double)((int)pfVar15 * ((int)uVar9 * 2 + 1)) * 3.141592653589793 * 0.0625);
              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                Image::getFlPixelPtr((Image *)local_3c0);
                fVar17 = *(float *)(*(long *)(*(long *)local_3c0._0_8_ + uVar12 * 0x18) +
                                    (long)dVar16 + lVar14 * 4);
                dVar1 = cos((double)local_388._M_pi);
                dVar2 = cos(local_378);
                *(float *)((long)&local_398._M_pi + lVar14 * 4) =
                     (float)(dVar2 * dVar1 * (double)fVar17 +
                            (double)*(float *)((long)&local_398._M_pi + lVar14 * 4));
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c0 + 8));
              }
              dVar16 = (double)((long)dVar16 + 0xc);
              pfVar15 = (float *)local_3c0._32_8_;
            }
          }
          fVar18 = *(float *)(&DAT_00129cf8 + (ulong)(pfVar15 == (float *)0x0) * 4) * Cv;
          fVar17 = local_390 * fVar18;
          __x = fVar18 * SUB84(local_398._M_pi,0) * 100.0;
          aStack_370._M_allocated_capacity._0_4_ = fVar18 * 0.0 * 0.0;
          aStack_370._M_allocated_capacity._4_4_ = fVar18 * 0.0 * 0.0;
          local_378 = (double)CONCAT44(fVar18 * (float)((ulong)local_398._M_pi >> 0x20) * 100.0,__x)
          ;
          fVar18 = roundf(__x);
          local_388._M_pi._0_4_ = fVar18;
          local_388._M_pi._4_4_ = extraout_XMM0_Db;
          fVar18 = roundf(local_378._4_4_);
          paVar4 = local_340;
          auVar19._4_4_ = local_388._M_pi._4_4_;
          auVar19._0_4_ = local_388._M_pi._0_4_;
          auVar19._8_4_ = local_388._M_pi._4_4_;
          auVar19._12_4_ = extraout_XMM0_Db_00;
          auVar20._8_8_ = auVar19._8_8_;
          auVar20._4_4_ = fVar18;
          auVar20._0_4_ = local_388._M_pi._0_4_;
          auVar20 = divps(auVar20,_DAT_00129d00);
          *(long *)local_340->_M_elems[(long)pfVar15].comp = auVar20._0_8_;
          fVar17 = roundf(fVar17 * 100.0);
          paVar4->_M_elems[(long)pfVar15].comp[2] = fVar17 / 100.0;
          uVar12 = aStack_370._8_8_;
        }
        pcVar10 = local_360._M_p + 1;
      }
      pfVar15 = coefficients._M_elems[0]._M_elems[0].comp + 2;
      for (uVar9 = uVar12; uVar9 != local_3c0._24_8_; uVar9 = uVar9 + 1) {
        sVar11 = 8;
        local_3c0._32_8_ = pfVar15;
        local_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._16_8_;
        while (sVar11 != 0) {
          fVar17 = ((FPixel *)(pfVar15 + -2))->comp[0];
          local_378 = (double)(sVar11 - 1);
          Image::getFlPixelPtr((Image *)local_3c0);
          _Var3._M_pi = local_388._M_pi;
          lVar14 = uVar9 * 0x18;
          *(float *)((long)&(local_388._M_pi)->_vptr__Sp_counted_base +
                    *(long *)(*(long *)local_3c0._0_8_ + lVar14)) = fVar17;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c0 + 8));
          fVar17 = pfVar15[-1];
          Image::getFlPixelPtr((Image *)local_3c0);
          *(float *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base +
                    *(long *)(*(long *)local_3c0._0_8_ + lVar14) + 4) = fVar17;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c0 + 8));
          fVar17 = *pfVar15;
          Image::getFlPixelPtr((Image *)local_3c0);
          *(float *)((long)&(_Var3._M_pi)->_M_use_count +
                    *(long *)(*(long *)local_3c0._0_8_ + lVar14)) = fVar17;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c0 + 8));
          local_388._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&(_Var3._M_pi)->_M_weak_count;
          pfVar15 = pfVar15 + 3;
          sVar11 = (size_type)local_378;
        }
        pfVar15 = (float *)(local_3c0._32_8_ + 0x60);
        uVar12 = aStack_370._8_8_;
      }
      local_358 = local_358 + 8;
      local_3c0._16_8_ = local_3c0._16_8_ + 0x60;
      uVar13 = local_350._8_8_;
    }
    local_3c0._24_8_ = local_3c0._24_8_ + 8;
    uVar12 = local_350._M_allocated_capacity;
  }
  pLVar7 = Logger::get();
  LVar5 = Logger::getLevel(pLVar7);
  if (0 < (int)LVar5) {
    pLVar7 = Logger::get();
    poVar8 = Logger::getStream(pLVar7);
    Logger::levelStr_abi_cxx11_((string *)&coefficients,(Logger *)0x1,lvl_00);
    poVar8 = std::operator<<(poVar8,(string *)&coefficients);
    poVar8 = std::operator<<(poVar8,"[ kpeg:");
    poVar8 = std::operator<<(poVar8,"Encoder.cpp");
    poVar8 = std::operator<<(poVar8,":");
    *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x1f2);
    poVar8 = std::operator<<(poVar8," ] ");
    poVar8 = std::operator<<(poVar8,"Forward DCT applied [OK]");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&coefficients);
  }
  return;
}

Assistant:

void kpeg::JPEGEncoder::computeDCT()
    {
        LOG(Logger::Level::INFO) << "Applying Forward DCT on components..." << std::endl;
        
        // Traverse the pixel pointer, 8x8 blocks at a time
        for ( int iy = 0; iy + 8 - 1 < m_image.getHeight(); iy += 8 )
        {
            for ( int ix = 0; ix + 8 - 1 < m_image.getWidth(); ix += 8 )
            {
                std::array<std::array<FPixel, 8>, 8> coefficients;
                
                for ( int v = 0; v < 8; ++v )
                {
                    for ( int u = 0; u < 8; ++u )
                    {
                        float Cu = u == 0 ? 1.0 / std::sqrt(2.f) : 1.f;
                        float Cv = v == 0 ? 1.0 / std::sqrt(2.f) : 1.f;
                        float coeff[3] = { 0.f, 0.f, 0.f };
                        
                        for ( int y = iy; y < iy + 8; ++y )
                        {
                            for ( int x = ix; x < ix + 8; ++x )
                            {
                                for ( int c = 0; c < 3; ++c )
                                {
                                    coeff[c] += (*m_image.getFlPixelPtr())[y][x].comp[c] *
                                                 std::cos( ( 2 * x + 1 ) * u * M_PI / 16 ) *
                                                  std::cos( ( 2 * y + 1 ) * v * M_PI / 16 );
                                }
                            }
                        }
                        
                        coeff[YCbCrComponents::Y] = 0.25f * Cu * Cv * coeff[0];
                        coeff[YCbCrComponents::Cb] = 0.25f * Cu * Cv * coeff[1];
                        coeff[YCbCrComponents::Cr] = 0.25f * Cu * Cv * coeff[2];
                        
                        coefficients[v][u].comp[YCbCrComponents::Y] = std::roundf( coeff[YCbCrComponents::Y] * 100 ) / 100;
                        coefficients[v][u].comp[YCbCrComponents::Cb] = std::roundf( coeff[YCbCrComponents::Cb] * 100 ) / 100;
                        coefficients[v][u].comp[YCbCrComponents::Cr] = std::roundf( coeff[YCbCrComponents::Cr] * 100 ) / 100;
                    }
                }
                
                for ( int y = iy; y < iy + 8; ++y )
                {
                    for ( int x = ix; x < ix + 8; ++x )
                    {
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Y] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Y];
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cb] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Cb];
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cr] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Cr];
                    }
                }
            }
        }
        
//         for ( auto&& row : *m_image.getFlPixelPtr() )
//         {
//             for ( auto&& val : row )
//             {
//                 std::cout << val.comp[0] << "," << val.comp[1] << "," << val.comp[2] << "\t";
//             }
//             std::cout << std::endl;
//         }
//         std::cout << std::endl;
        
        LOG(Logger::Level::INFO) << "Forward DCT applied [OK]" << std::endl;
    }